

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

VTimeZone * icu_63::VTimeZone::createVTimeZone(UnicodeString *vtzdata,UErrorCode *status)

{
  UBool UVar1;
  VTimeZone *this;
  VTimeZone *local_60;
  VTimeZone *vtz;
  VTZReader reader;
  UErrorCode *status_local;
  UnicodeString *vtzdata_local;
  
  reader._8_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    VTZReader::VTZReader((VTZReader *)&vtz,vtzdata);
    this = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,(size_t)vtzdata);
    local_60 = (VTimeZone *)0x0;
    if (this != (VTimeZone *)0x0) {
      VTimeZone(this);
      local_60 = this;
    }
    load(local_60,(VTZReader *)&vtz,(UErrorCode *)reader._8_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)reader._8_8_);
    if (UVar1 == '\0') {
      vtzdata_local = (UnicodeString *)local_60;
    }
    else {
      if (local_60 != (VTimeZone *)0x0) {
        (*(local_60->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
      }
      vtzdata_local = (UnicodeString *)0x0;
    }
    VTZReader::~VTZReader((VTZReader *)&vtz);
  }
  else {
    vtzdata_local = (UnicodeString *)0x0;
  }
  return (VTimeZone *)vtzdata_local;
}

Assistant:

VTimeZone*
VTimeZone::createVTimeZone(const UnicodeString& vtzdata, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    VTZReader reader(vtzdata);
    VTimeZone *vtz = new VTimeZone();
    vtz->load(reader, status);
    if (U_FAILURE(status)) {
        delete vtz;
        return NULL;
    }
    return vtz;
}